

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_analysis.cc
# Opt level: O2

void absl::lts_20250127::cord_internal::anon_unknown_0::
     AnalyzeDataEdge<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)2>
               (CordRepRef<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)2> rep,
               RawUsage<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)2>
               *raw_usage)

{
  bool bVar1;
  byte bVar2;
  CordRepSubstring *pCVar3;
  CordRepFlat *this;
  size_t size;
  
  bVar1 = IsDataEdge(rep.rep);
  if (bVar1) {
    bVar2 = (rep.rep)->tag;
    if (bVar2 == 1) {
      RawUsage<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)2>::Add
                (raw_usage,0x20,rep);
      pCVar3 = CordRep::substring(rep.rep);
      rep.rep = pCVar3->child;
      bVar2 = (rep.rep)->tag;
    }
    if (bVar2 < 6) {
      size = (rep.rep)->length + 0x28;
    }
    else {
      this = CordRep::flat(rep.rep);
      size = CordRepFlat::AllocatedSize(this);
    }
    RawUsage<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)2>::Add
              (raw_usage,size,rep);
    return;
  }
  __assert_fail("IsDataEdge(rep.rep)",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/cord_analysis.cc"
                ,0x78,
                "void absl::cord_internal::(anonymous namespace)::AnalyzeDataEdge(CordRepRef<mode>, RawUsage<mode> &) [mode = absl::cord_internal::(anonymous namespace)::Mode::kTotalMorePrecise]"
               );
}

Assistant:

void AnalyzeDataEdge(CordRepRef<mode> rep, RawUsage<mode>& raw_usage) {
  assert(IsDataEdge(rep.rep));

  // Consume all substrings
  if (rep.rep->tag == SUBSTRING) {
    raw_usage.Add(sizeof(CordRepSubstring), rep);
    rep = rep.Child(rep.rep->substring()->child);
  }

  // Consume FLAT / EXTERNAL
  const size_t size =
      rep.rep->tag >= FLAT
          ? rep.rep->flat()->AllocatedSize()
          : rep.rep->length + sizeof(CordRepExternalImpl<intptr_t>);
  raw_usage.Add(size, rep);
}